

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

LiteralNumber * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::LiteralNumber,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::__cxx11::string&>
          (Allocator *this,LocationRange *args,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_1,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  LiteralNumber *this_00;
  LiteralNumber *local_30;
  
  this_00 = (LiteralNumber *)operator_new(0xa8);
  LiteralNumber::LiteralNumber(this_00,args,args_1,args_2);
  local_30 = this_00;
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            (&this->allocated,(value_type *)&local_30);
  return this_00;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }